

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

uint OrdinalUnsignedToIgnoreCase(uint c,uint maximum_singleton_value)

{
  ON_StringMapOrdinalType map_type_00;
  ON__UINT32 OVar1;
  bool bVar2;
  ON_StringMapOrdinalType map_type;
  uint maximum_singleton_value_local;
  uint c_local;
  
  bVar2 = false;
  if ((c < 0x7b) && (bVar2 = false, 0x40 < c)) {
    bVar2 = 0x79 < maximum_singleton_value;
  }
  map_type_00 = MinimumOrdinal;
  if (bVar2) {
    map_type_00 = LowerOrdinal;
  }
  OVar1 = MapCodePointOrdinal(c,maximum_singleton_value,map_type_00);
  return OVar1;
}

Assistant:

static unsigned int OrdinalUnsignedToIgnoreCase(
  unsigned int c,
  unsigned int maximum_singleton_value
  )
{
  // RH-41224
  // map A -> a, ..., Z -> z so underbar is before any "letter".
  // The preserves the behavior of Rhino component name sorting
  // that used "ancient" C runtime ASCII sorts.
  const ON_StringMapOrdinalType map_type
    = ( c <= 0x7A && c >= 0x41 && maximum_singleton_value >= 0x7A )
    ? ON_StringMapOrdinalType::LowerOrdinal
    : ON_StringMapOrdinalType::MinimumOrdinal;
  return MapCodePointOrdinal(c, maximum_singleton_value, map_type);
}